

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::PushTextureID(ImDrawList *this,ImTextureID texture_id)

{
  ImTextureID local_10;
  
  local_10 = texture_id;
  ImVector<void_*>::push_back(&this->_TextureIdStack,&local_10);
  UpdateTextureID(this);
  return;
}

Assistant:

void ImDrawList::PushTextureID(ImTextureID texture_id)
{
    _TextureIdStack.push_back(texture_id);
    UpdateTextureID();
}